

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load_node
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          V *values,int num_keys,AlexNode<int,_int> **node,int total_keys,
          LinearModel<int> *data_node_model)

{
  int *piVar1;
  int iVar2;
  short sVar3;
  AlexNode<int,_int> *pAVar4;
  _func_int *p_Var5;
  pointer pFVar6;
  int iVar7;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *pAVar8;
  self_type *psVar9;
  _func_int **pp_Var10;
  long lVar11;
  uint uVar12;
  FTNode *tree_node;
  pointer pFVar13;
  uint uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  pair<int,_double> pVar21;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  used_fanout_tree_nodes;
  LinearModel<int> local_58;
  double local_48;
  
  dVar19 = (double)num_keys;
  dVar17 = (double)(this->derived_params_).max_data_node_slots * 0.7;
  if ((dVar17 < dVar19) ||
     ((20.0 <= (*node)->cost_ && ((dVar18 = ((*node)->model_).a_, dVar18 != 0.0 || (NAN(dVar18))))))
     ) {
    used_fanout_tree_nodes.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    used_fanout_tree_nodes.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    used_fanout_tree_nodes.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar7 = (this->experimental_params_).fanout_selection_method;
    if (iVar7 == 1) {
      pVar21 = fanout_tree::find_best_fanout_top_down<int,int,alex::AlexCompare>
                         ((this->params_).expected_insert_frac,values,num_keys,*node,total_keys,
                          &used_fanout_tree_nodes,(this->derived_params_).max_fanout,
                          (this->params_).approximate_model_computation,
                          (this->params_).approximate_cost_computation);
      dVar17 = pVar21.second;
      uVar14 = pVar21.first;
    }
    else if (iVar7 == 0) {
      pVar21 = fanout_tree::find_best_fanout_bottom_up<int,int,alex::AlexCompare>
                         ((this->params_).expected_insert_frac,values,num_keys,*node,total_keys,
                          &used_fanout_tree_nodes,(this->derived_params_).max_fanout,(int)dVar17,
                          (this->params_).approximate_model_computation,
                          (this->params_).approximate_cost_computation);
      dVar17 = pVar21.second;
      uVar14 = pVar21.first;
    }
    else {
      dVar17 = 0.0;
      uVar14 = 0;
    }
    if ((dVar17 < (*node)->cost_) ||
       ((double)(this->derived_params_).max_data_node_slots * 0.7 < dVar19)) {
      piVar1 = &(this->stats_).num_model_nodes;
      *piVar1 = *piVar1 + 1;
      pAVar8 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                *)operator_new(0x40);
      sVar3 = (*node)->level_;
      (pAVar8->super_AlexNode<int,_int>).is_leaf_ = false;
      (pAVar8->super_AlexNode<int,_int>).duplication_factor_ = '\0';
      (pAVar8->super_AlexNode<int,_int>).level_ = sVar3;
      (pAVar8->super_AlexNode<int,_int>).model_.a_ = 0.0;
      (pAVar8->super_AlexNode<int,_int>).model_.b_ = 0.0;
      (pAVar8->super_AlexNode<int,_int>).cost_ = 0.0;
      (pAVar8->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)&PTR__AlexModelNode_00164b98
      ;
      pAVar8->key_less_ = (AlexCompare *)&this->field_0xbd;
      *(undefined4 *)&pAVar8->allocator_ = 0;
      pAVar8->next_leaf_ = (self_type *)0x0;
      if (uVar14 == 0) {
        dVar17 = log2(dVar19 / (double)(this->derived_params_).max_data_node_slots);
        uVar14 = (int)dVar17 + 1;
        if (used_fanout_tree_nodes.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            used_fanout_tree_nodes.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          used_fanout_tree_nodes.
          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               used_fanout_tree_nodes.
               super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        fanout_tree::compute_level<int,int,std::less<int>>
                  ((this->params_).expected_insert_frac,values,num_keys,*node,total_keys,
                   &used_fanout_tree_nodes,uVar14,
                   (int)((double)(this->derived_params_).max_data_node_slots * 0.7),
                   (this->params_).approximate_model_computation,
                   (this->params_).approximate_cost_computation);
      }
      iVar7 = 1 << (uVar14 & 0x1f);
      local_48 = (double)iVar7;
      dVar17 = ((*node)->model_).b_;
      (pAVar8->super_AlexNode<int,_int>).model_.a_ = local_48 * ((*node)->model_).a_;
      (pAVar8->super_AlexNode<int,_int>).model_.b_ = local_48 * dVar17;
      *(int *)&pAVar8->allocator_ = iVar7;
      psVar9 = (self_type *)
               __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                         ((new_allocator<alex::AlexNode<int,_int>_*> *)&local_58,(long)iVar7,
                          (void *)0x0);
      pFVar6 = used_fanout_tree_nodes.
               super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pAVar8->next_leaf_ = psVar9;
      if (used_fanout_tree_nodes.
          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          used_fanout_tree_nodes.
          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pFVar13 = used_fanout_tree_nodes.
                  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar7 = 0;
        do {
          pp_Var10 = (_func_int **)operator_new(0x40);
          pAVar4 = *node;
          sVar3 = pAVar4->level_;
          *(undefined2 *)(pp_Var10 + 1) = 0;
          *(short *)((long)pp_Var10 + 10) = sVar3 + 1;
          pp_Var10[2] = (_func_int *)0x0;
          pp_Var10[3] = (_func_int *)0x0;
          pp_Var10[4] = (_func_int *)0x0;
          *pp_Var10 = (_func_int *)&PTR__AlexModelNode_00164b98;
          pp_Var10[5] = (_func_int *)&this->field_0xbd;
          *(undefined4 *)(pp_Var10 + 6) = 0;
          pp_Var10[7] = (_func_int *)0x0;
          pp_Var10[4] = (_func_int *)pFVar13->cost;
          uVar12 = uVar14 - pFVar13->level;
          *(char *)((long)pp_Var10 + 9) = (char)uVar12;
          iVar15 = 1 << (uVar12 & 0x1f);
          iVar2 = iVar15 + iVar7;
          dVar17 = (pAVar4->model_).a_;
          dVar19 = (pAVar4->model_).b_;
          dVar18 = ((double)iVar7 / local_48 - dVar19) / dVar17;
          auVar20._0_8_ =
               (_func_int *)(1.0 / (((double)iVar2 / local_48 - dVar19) / dVar17 - dVar18));
          auVar20._8_8_ = 0;
          pp_Var10[2] = auVar20._0_8_;
          auVar16._8_8_ = 0x8000000000000000;
          auVar16._0_8_ = 0x8000000000000000;
          auVar16 = vxorpd_avx512vl(auVar20,auVar16);
          pp_Var10[3] = (_func_int *)(dVar18 * auVar16._0_8_);
          (&(pAVar8->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[iVar7] = pp_Var10;
          local_58.a_ = pFVar13->a;
          local_58.b_ = pFVar13->b;
          bulk_load_node(this,values + pFVar13->left_boundary,
                         pFVar13->right_boundary - pFVar13->left_boundary,
                         (AlexNode<int,_int> **)
                         (&(pAVar8->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode + iVar7),
                         total_keys,&local_58);
          pp_Var10 = (&(pAVar8->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[iVar7];
          *(char *)((long)pp_Var10 + 9) = (char)uVar14 - (char)pFVar13->level;
          if (*(char *)(pp_Var10 + 1) == '\x01') {
            p_Var5 = (_func_int *)pFVar13->expected_avg_shifts;
            pp_Var10[0x17] = (_func_int *)pFVar13->expected_avg_search_iterations;
            pp_Var10[0x18] = p_Var5;
          }
          if (1 < iVar15) {
            lVar11 = (long)(iVar7 + 1);
            do {
              (&(pAVar8->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar11] =
                   (&(pAVar8->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[iVar7];
              lVar11 = lVar11 + 1;
            } while (lVar11 < iVar2);
          }
          pFVar13 = pFVar13 + 1;
          iVar7 = iVar2;
        } while (pFVar13 != pFVar6);
      }
      delete_node(this,*node);
    }
    else {
      piVar1 = &(this->stats_).num_data_nodes;
      *piVar1 = *piVar1 + 1;
      pAVar8 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                *)operator_new(200);
      sVar3 = (*node)->level_;
      iVar7 = (this->derived_params_).max_data_node_slots;
      (pAVar8->super_AlexNode<int,_int>).is_leaf_ = true;
      (pAVar8->super_AlexNode<int,_int>).duplication_factor_ = '\0';
      (pAVar8->super_AlexNode<int,_int>).level_ = sVar3;
      (pAVar8->super_AlexNode<int,_int>).model_.a_ = 0.0;
      (pAVar8->super_AlexNode<int,_int>).model_.b_ = 0.0;
      (pAVar8->super_AlexNode<int,_int>).cost_ = 0.0;
      (pAVar8->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)&PTR__AlexDataNode_00164b20;
      pAVar8->key_less_ = (AlexCompare *)&this->field_0xbc;
      pAVar8->allocator_ = (allocator<std::pair<int,_int>_> *)&this->field_0xbd;
      pAVar8->next_leaf_ = (self_type *)0x0;
      pAVar8->prev_leaf_ = (self_type *)0x0;
      pAVar8->key_slots_ = (int *)0x0;
      pAVar8->payload_slots_ = (int *)0x0;
      *(undefined8 *)((long)&pAVar8->key_slots_ + 4) = 0;
      *(undefined8 *)((long)&pAVar8->payload_slots_ + 4) = 0;
      *(undefined8 *)&pAVar8->num_keys_ = 0;
      *(undefined8 *)((long)&pAVar8->bitmap_ + 4) = 0;
      pAVar8->expansion_threshold_ = 1.0;
      pAVar8->contraction_threshold_ = 0.0;
      pAVar8->max_slots_ = iVar7;
      pAVar8->num_shifts_ = 0;
      pAVar8->num_exp_search_iterations_ = 0;
      *(undefined8 *)((long)&pAVar8->num_exp_search_iterations_ + 4) = 0;
      pAVar8->num_inserts_ = 0;
      pAVar8->num_resizes_ = 0;
      pAVar8->max_key_ = -0x80000000;
      pAVar8->min_key_ = 0x7fffffff;
      pAVar8->num_right_out_of_bounds_inserts_ = 0;
      pAVar8->num_left_out_of_bounds_inserts_ = 0;
      pAVar8->expected_avg_exp_search_iterations_ = 0.0;
      pAVar8->expected_avg_shifts_ = 0.0;
      AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
      bulk_load(pAVar8,values,num_keys,data_node_model,(this->params_).approximate_model_computation
               );
      pAVar4 = *node;
      (pAVar8->super_AlexNode<int,_int>).cost_ = pAVar4->cost_;
      delete_node(this,pAVar4);
    }
    *node = &pAVar8->super_AlexNode<int,_int>;
    if (used_fanout_tree_nodes.
        super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(used_fanout_tree_nodes.
                      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)used_fanout_tree_nodes.
                            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)used_fanout_tree_nodes.
                            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    piVar1 = &(this->stats_).num_data_nodes;
    *piVar1 = *piVar1 + 1;
    pAVar8 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
              *)operator_new(200);
    sVar3 = (*node)->level_;
    iVar7 = (this->derived_params_).max_data_node_slots;
    (pAVar8->super_AlexNode<int,_int>).is_leaf_ = true;
    (pAVar8->super_AlexNode<int,_int>).duplication_factor_ = '\0';
    (pAVar8->super_AlexNode<int,_int>).level_ = sVar3;
    (pAVar8->super_AlexNode<int,_int>).model_.a_ = 0.0;
    (pAVar8->super_AlexNode<int,_int>).model_.b_ = 0.0;
    (pAVar8->super_AlexNode<int,_int>).cost_ = 0.0;
    (pAVar8->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)&PTR__AlexDataNode_00164b20;
    pAVar8->key_less_ = (AlexCompare *)&this->field_0xbc;
    pAVar8->allocator_ = (allocator<std::pair<int,_int>_> *)&this->field_0xbd;
    *(undefined8 *)((long)&pAVar8->key_slots_ + 4) = 0;
    *(undefined8 *)((long)&pAVar8->payload_slots_ + 4) = 0;
    *(undefined8 *)&pAVar8->num_keys_ = 0;
    *(undefined8 *)((long)&pAVar8->bitmap_ + 4) = 0;
    pAVar8->next_leaf_ = (self_type *)0x0;
    pAVar8->prev_leaf_ = (self_type *)0x0;
    pAVar8->key_slots_ = (int *)0x0;
    pAVar8->payload_slots_ = (int *)0x0;
    pAVar8->expansion_threshold_ = 1.0;
    pAVar8->contraction_threshold_ = 0.0;
    pAVar8->max_slots_ = iVar7;
    *(undefined8 *)((long)&pAVar8->num_exp_search_iterations_ + 4) = 0;
    pAVar8->num_inserts_ = 0;
    pAVar8->num_resizes_ = 0;
    pAVar8->num_shifts_ = 0;
    pAVar8->num_exp_search_iterations_ = 0;
    pAVar8->max_key_ = -0x80000000;
    pAVar8->min_key_ = 0x7fffffff;
    pAVar8->num_right_out_of_bounds_inserts_ = 0;
    pAVar8->num_left_out_of_bounds_inserts_ = 0;
    pAVar8->expected_avg_exp_search_iterations_ = 0.0;
    pAVar8->expected_avg_shifts_ = 0.0;
    AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load
              (pAVar8,values,num_keys,data_node_model,(this->params_).approximate_model_computation)
    ;
    pAVar4 = *node;
    (pAVar8->super_AlexNode<int,_int>).cost_ = pAVar4->cost_;
    delete_node(this,pAVar4);
    *node = (AlexNode<int,_int> *)pAVar8;
  }
  return;
}

Assistant:

void bulk_load_node(const V values[], int num_keys, AlexNode<T, P>*& node,
                      int total_keys,
                      const LinearModel<T>* data_node_model = nullptr) {
    // Automatically convert to data node when it is impossible to be better
    // than current cost
    if (num_keys <= derived_params_.max_data_node_slots *
                        data_node_type::kInitDensity_ &&
        (node->cost_ < kNodeLookupsWeight || node->model_.a_ == 0)) {
      stats_.num_data_nodes++;
      auto data_node = new (data_node_allocator().allocate(1))
          data_node_type(node->level_, derived_params_.max_data_node_slots,
                         key_less_, allocator_);
      data_node->bulk_load(values, num_keys, data_node_model,
                           params_.approximate_model_computation);
      data_node->cost_ = node->cost_;
      delete_node(node);
      node = data_node;
      return;
    }

    // Use a fanout tree to determine the best way to divide the key space into
    // child nodes
    std::vector<fanout_tree::FTNode> used_fanout_tree_nodes;
    std::pair<int, double> best_fanout_stats;
    if (experimental_params_.fanout_selection_method == 0) {
      int max_data_node_keys = static_cast<int>(
          derived_params_.max_data_node_slots * data_node_type::kInitDensity_);
      best_fanout_stats = fanout_tree::find_best_fanout_bottom_up<T, P>(
          values, num_keys, node, total_keys, used_fanout_tree_nodes,
          derived_params_.max_fanout, max_data_node_keys,
          params_.expected_insert_frac, params_.approximate_model_computation,
          params_.approximate_cost_computation, key_less_);
    } else if (experimental_params_.fanout_selection_method == 1) {
      best_fanout_stats = fanout_tree::find_best_fanout_top_down<T, P>(
          values, num_keys, node, total_keys, used_fanout_tree_nodes,
          derived_params_.max_fanout, params_.expected_insert_frac,
          params_.approximate_model_computation,
          params_.approximate_cost_computation, key_less_);
    }
    int best_fanout_tree_depth = best_fanout_stats.first;
    double best_fanout_tree_cost = best_fanout_stats.second;

    // Decide whether this node should be a model node or data node
    if (best_fanout_tree_cost < node->cost_ ||
        num_keys > derived_params_.max_data_node_slots *
                       data_node_type::kInitDensity_) {
      // Convert to model node based on the output of the fanout tree
      stats_.num_model_nodes++;
      auto model_node = new (model_node_allocator().allocate(1))
          model_node_type(node->level_, allocator_);
      if (best_fanout_tree_depth == 0) {
        // slightly hacky: we assume this means that the node is relatively
        // uniform but we need to split in
        // order to satisfy the max node size, so we compute the fanout that
        // would satisfy that condition
        // in expectation
        best_fanout_tree_depth =
            static_cast<int>(std::log2(static_cast<double>(num_keys) /
                                       derived_params_.max_data_node_slots)) +
            1;
        used_fanout_tree_nodes.clear();
        int max_data_node_keys = static_cast<int>(
            derived_params_.max_data_node_slots * data_node_type::kInitDensity_);
        fanout_tree::compute_level<T, P>(
            values, num_keys, node, total_keys, used_fanout_tree_nodes,
            best_fanout_tree_depth, max_data_node_keys,
            params_.expected_insert_frac, params_.approximate_model_computation,
            params_.approximate_cost_computation);
      }
      int fanout = 1 << best_fanout_tree_depth;
      model_node->model_.a_ = node->model_.a_ * fanout;
      model_node->model_.b_ = node->model_.b_ * fanout;
      model_node->num_children_ = fanout;
      model_node->children_ =
          new (pointer_allocator().allocate(fanout)) AlexNode<T, P>*[fanout];

      // Instantiate all the child nodes and recurse
      int cur = 0;
      for (fanout_tree::FTNode& tree_node : used_fanout_tree_nodes) {
        auto child_node = new (model_node_allocator().allocate(1))
            model_node_type(static_cast<short>(node->level_ + 1), allocator_);
        child_node->cost_ = tree_node.cost;
        child_node->duplication_factor_ =
            static_cast<uint8_t>(best_fanout_tree_depth - tree_node.level);
        int repeats = 1 << child_node->duplication_factor_;
        double left_value = static_cast<double>(cur) / fanout;
        double right_value = static_cast<double>(cur + repeats) / fanout;
        double left_boundary = (left_value - node->model_.b_) / node->model_.a_;
        double right_boundary =
            (right_value - node->model_.b_) / node->model_.a_;
        child_node->model_.a_ = 1.0 / (right_boundary - left_boundary);
        child_node->model_.b_ = -child_node->model_.a_ * left_boundary;
        model_node->children_[cur] = child_node;
        LinearModel<T> child_data_node_model(tree_node.a, tree_node.b);
        bulk_load_node(values + tree_node.left_boundary,
                       tree_node.right_boundary - tree_node.left_boundary,
                       model_node->children_[cur], total_keys,
                       &child_data_node_model);
        model_node->children_[cur]->duplication_factor_ =
            static_cast<uint8_t>(best_fanout_tree_depth - tree_node.level);
        if (model_node->children_[cur]->is_leaf_) {
          static_cast<data_node_type*>(model_node->children_[cur])
              ->expected_avg_exp_search_iterations_ =
              tree_node.expected_avg_search_iterations;
          static_cast<data_node_type*>(model_node->children_[cur])
              ->expected_avg_shifts_ = tree_node.expected_avg_shifts;
        }
        for (int i = cur + 1; i < cur + repeats; i++) {
          model_node->children_[i] = model_node->children_[cur];
        }
        cur += repeats;
      }

      delete_node(node);
      node = model_node;
    } else {
      // Convert to data node
      stats_.num_data_nodes++;
      auto data_node = new (data_node_allocator().allocate(1))
          data_node_type(node->level_, derived_params_.max_data_node_slots,
                         key_less_, allocator_);
      data_node->bulk_load(values, num_keys, data_node_model,
                           params_.approximate_model_computation);
      data_node->cost_ = node->cost_;
      delete_node(node);
      node = data_node;
    }
  }